

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::dictReplace(dic *this,int dictidx,dictEntry newde)

{
  reference pvVar1;
  void *pvVar2;
  int index;
  dictEntry *fetch;
  int dictidx_local;
  dic *this_local;
  
  pvVar1 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  if (pvVar1->rehashidx == -1) {
    pvVar2 = dict_find(this,dictidx,0,newde.key);
    if (pvVar2 == (void *)0x0) {
      this_local._4_4_ = dictAdd(this,dictidx,newde.key,newde.v.val);
    }
    else {
      *(anon_union_8_2_743ab2ba_for_v *)((long)pvVar2 + 8) = newde.v;
      this_local._4_4_ = 1;
    }
  }
  else {
    pvVar2 = dict_find(this,dictidx,0,newde.key);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = dict_find(this,dictidx,1,newde.key);
      if (pvVar2 == (void *)0x0) {
        this_local._4_4_ = dictAdd(this,dictidx,newde.key,newde.v.val);
      }
      else {
        *(anon_union_8_2_743ab2ba_for_v *)((long)pvVar2 + 8) = newde.v;
        this_local._4_4_ = 1;
      }
    }
    else {
      *(anon_union_8_2_743ab2ba_for_v *)((long)pvVar2 + 8) = newde.v;
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int dic::dictReplace(int dictidx,dictEntry newde){
    dictEntry *fetch=NULL;
    if(dc[dictidx].rehashidx==-1){    
        fetch=(dictEntry *)dic::dict_find(dictidx,0,newde.key);
        if(fetch!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        }else{
            int index=dic::dictAdd(dictidx,newde.key,newde.v.val);
            return index; 
        }
    }
    else{
        fetch=(dictEntry *)dic::dict_find(dictidx,0,newde.key);
        if(fetch!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        } else if((fetch=(dictEntry *)dic::dict_find(dictidx,1,newde.key))!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        }
        return dic::dictAdd(dictidx,newde.key,newde.v.val);
    }
}